

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O1

void __thiscall
deqp::RobustBufferAccessBehavior::VertexBufferObjectsTest::cleanTexture
          (VertexBufferObjectsTest *this,GLuint texture_id)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  GLubyte pixels [64];
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  pixels[0x30] = 0x80;
  pixels[0x31] = 0x80;
  pixels[0x32] = 0x80;
  pixels[0x33] = 0x80;
  pixels[0x34] = 0x80;
  pixels[0x35] = 0x80;
  pixels[0x36] = 0x80;
  pixels[0x37] = 0x80;
  pixels[0x38] = 0x80;
  pixels[0x39] = 0x80;
  pixels[0x3a] = 0x80;
  pixels[0x3b] = 0x80;
  pixels[0x3c] = 0x80;
  pixels[0x3d] = 0x80;
  pixels[0x3e] = 0x80;
  pixels[0x3f] = 0x80;
  pixels[0x20] = 0x80;
  pixels[0x21] = 0x80;
  pixels[0x22] = 0x80;
  pixels[0x23] = 0x80;
  pixels[0x24] = 0x80;
  pixels[0x25] = 0x80;
  pixels[0x26] = 0x80;
  pixels[0x27] = 0x80;
  pixels[0x28] = 0x80;
  pixels[0x29] = 0x80;
  pixels[0x2a] = 0x80;
  pixels[0x2b] = 0x80;
  pixels[0x2c] = 0x80;
  pixels[0x2d] = 0x80;
  pixels[0x2e] = 0x80;
  pixels[0x2f] = 0x80;
  pixels[0x10] = 0x80;
  pixels[0x11] = 0x80;
  pixels[0x12] = 0x80;
  pixels[0x13] = 0x80;
  pixels[0x14] = 0x80;
  pixels[0x15] = 0x80;
  pixels[0x16] = 0x80;
  pixels[0x17] = 0x80;
  pixels[0x18] = 0x80;
  pixels[0x19] = 0x80;
  pixels[0x1a] = 0x80;
  pixels[0x1b] = 0x80;
  pixels[0x1c] = 0x80;
  pixels[0x1d] = 0x80;
  pixels[0x1e] = 0x80;
  pixels[0x1f] = 0x80;
  pixels[0] = 0x80;
  pixels[1] = 0x80;
  pixels[2] = 0x80;
  pixels[3] = 0x80;
  pixels[4] = 0x80;
  pixels[5] = 0x80;
  pixels[6] = 0x80;
  pixels[7] = 0x80;
  pixels[8] = 0x80;
  pixels[9] = 0x80;
  pixels[10] = 0x80;
  pixels[0xb] = 0x80;
  pixels[0xc] = 0x80;
  pixels[0xd] = 0x80;
  pixels[0xe] = 0x80;
  pixels[0xf] = 0x80;
  (**(code **)(lVar3 + 0xb8))(0xde1,texture_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x28b);
  (**(code **)(lVar3 + 0x13b8))(0xde1,0,0,0,8,8,0x8d94,0x1401,pixels);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"TexSubImage2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x38f);
  (**(code **)(lVar3 + 0xb8))(0xde1,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x28b);
  return;
}

Assistant:

void VertexBufferObjectsTest::cleanTexture(glw::GLuint texture_id)
{
	static const GLuint height = 8;
	static const GLuint width  = 8;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	GLubyte pixels[width * height];
	for (GLuint i = 0; i < width * height; ++i)
	{
		pixels[i] = 128;
	}

	Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

	Texture::SubImage(gl, GL_TEXTURE_2D, 0 /* level  */, 0 /* x */, 0 /* y */, 0 /* z */, width, height, 0 /* depth */,
					  GL_RED_INTEGER, GL_UNSIGNED_BYTE, pixels);

	/* Unbind */
	Texture::Bind(gl, 0, GL_TEXTURE_2D);
}